

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O0

SyntaxPrinter * __thiscall slang::syntax::SyntaxPrinter::print(SyntaxPrinter *this,Trivia trivia)

{
  Token token;
  string_view text;
  Trivia trivia_00;
  bool bVar1;
  span<const_slang::parsing::Token,_18446744073709551615UL> *this_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  SyntaxPrinter *in_RDI;
  string_view sVar2;
  Token t_1;
  iterator __end4;
  iterator __begin4;
  span<const_slang::parsing::Token,_18446744073709551615UL> *__range4;
  Trivia *t;
  iterator __end5;
  iterator __begin5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> nestedTrivia;
  span<const_slang::parsing::Token,_18446744073709551615UL> *in_stack_ffffffffffffff18;
  Token *this_01;
  undefined1 in_stack_ffffffffffffff40 [16];
  SyntaxNode *in_stack_ffffffffffffff50;
  SyntaxNode *in_stack_ffffffffffffff58;
  SyntaxPrinter *in_stack_ffffffffffffff60;
  __normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
  local_88;
  span<const_slang::parsing::Token,_18446744073709551615UL> local_80;
  span<const_slang::parsing::Token,_18446744073709551615UL> *local_70;
  char *local_68;
  undefined8 local_60;
  reference local_58;
  Trivia *local_50;
  __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
  local_48;
  undefined1 *local_40;
  Token local_38;
  undefined1 local_28 [8];
  SyntaxPrinter *pSVar3;
  TriviaKind TStack_3;
  
  this_01 = in_stack_ffffffffffffff40._0_8_;
  pSVar3 = in_stack_ffffffffffffff40._8_8_;
  TStack_3 = (TriviaKind)((ulong)in_RDX >> 0x28);
  this_00 = (span<const_slang::parsing::Token,_18446744073709551615UL> *)
            (ulong)(byte)(TStack_3 - LineComment);
  switch(this_00) {
  case (span<const_slang::parsing::Token,_18446744073709551615UL> *)0x0:
  case (span<const_slang::parsing::Token,_18446744073709551615UL> *)0x1:
    if ((in_RDI->includeComments & 1U) == 0) {
      return in_RDI;
    }
  default:
    parsing::Trivia::getRawText((Trivia *)in_RDI);
    sVar2._M_str = (char *)in_stack_ffffffffffffff58;
    sVar2._M_len = (size_t)in_stack_ffffffffffffff50;
    append(pSVar3,sVar2);
    break;
  case (span<const_slang::parsing::Token,_18446744073709551615UL> *)0x2:
    if ((in_RDI->includeSkipped & 1U) != 0) {
      sVar2 = parsing::Trivia::getRawText((Trivia *)in_RDI);
      text._M_str = (char *)in_stack_ffffffffffffff58;
      text._M_len = (size_t)in_stack_ffffffffffffff50;
      append((SyntaxPrinter *)sVar2._M_str,text);
    }
    break;
  case (span<const_slang::parsing::Token,_18446744073709551615UL> *)0x3:
    if ((in_RDI->includeSkipped & 1U) != 0) {
      local_80 = parsing::Trivia::getSkippedTokens((Trivia *)in_RDI);
      local_70 = &local_80;
      local_88._M_current =
           (Token *)std::span<const_slang::parsing::Token,_18446744073709551615UL>::begin
                              (in_stack_ffffffffffffff18);
      std::span<const_slang::parsing::Token,_18446744073709551615UL>::end(this_00);
      while (bVar1 = __gnu_cxx::
                     operator==<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
                               ((__normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
                                 *)in_RDI,
                                (__normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
                                 *)in_stack_ffffffffffffff18), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
        ::operator*(&local_88);
        token.info = (Info *)this;
        token._0_8_ = nestedTrivia._M_extent._M_extent_value;
        print((SyntaxPrinter *)nestedTrivia._M_ptr,token);
        __gnu_cxx::
        __normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
        ::operator++(&local_88);
      }
    }
    break;
  case (span<const_slang::parsing::Token,_18446744073709551615UL> *)0x4:
    if ((in_RDI->includeSkipped & 1U) != 0) {
      parsing::Trivia::syntax((Trivia *)&stack0xfffffffffffffff0);
      print(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    break;
  case (span<const_slang::parsing::Token,_18446744073709551615UL> *)0x5:
    if ((in_RDI->includeDirectives & 1U) == 0) {
      if ((in_RDI->includePreprocessed & 1U) != 0) {
        pSVar3 = in_RDI;
        parsing::Trivia::syntax((Trivia *)&stack0xfffffffffffffff0);
        local_38 = SyntaxNode::getFirstToken(in_stack_ffffffffffffff50);
        _local_28 = parsing::Token::trivia(this_01);
        local_40 = local_28;
        local_48._M_current =
             (Trivia *)
             std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                       ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                        in_stack_ffffffffffffff18);
        local_50 = (Trivia *)
                   std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end
                             ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)this_00)
        ;
        while (bVar1 = __gnu_cxx::
                       operator==<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                                   *)in_RDI,
                                  (__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffff18), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_58 = __gnu_cxx::
                     __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                     ::operator*(&local_48);
          local_68 = (local_58->field_0).rawText.ptr;
          local_60 = *(undefined8 *)((long)&local_58->field_0 + 8);
          trivia_00._8_8_ = in_RSI;
          trivia_00.field_0.rawText.ptr = (char *)pSVar3;
          print((SyntaxPrinter *)local_28._8_8_,trivia_00);
          __gnu_cxx::
          __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
          ::operator++(&local_48);
        }
      }
    }
    else {
      parsing::Trivia::syntax((Trivia *)&stack0xfffffffffffffff0);
      print(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  return in_RDI;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::print(Trivia trivia) {
    switch (trivia.kind) {
        case TriviaKind::Directive:
            if (includeDirectives)
                print(*trivia.syntax());
            else if (includePreprocessed) {
                auto nestedTrivia = trivia.syntax()->getFirstToken().trivia();
                for (const auto& t : nestedTrivia)
                    print(t);
            }
            break;
        case TriviaKind::SkippedSyntax:
            if (includeSkipped)
                print(*trivia.syntax());
            break;
        case TriviaKind::SkippedTokens:
            if (includeSkipped) {
                for (Token t : trivia.getSkippedTokens())
                    print(t);
            }
            break;
        case TriviaKind::DisabledText:
            if (includeSkipped)
                append(trivia.getRawText());
            break;
        case TriviaKind::LineComment:
        case TriviaKind::BlockComment:
            if (!includeComments)
                break;
            [[fallthrough]];
        default:
            append(trivia.getRawText());
            break;
    }
    return *this;
}